

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall pbrt::SpotLight::PDF_Le(SpotLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [64];
  Vector3<float> VVar7;
  undefined1 extraout_var [60];
  
  *pdfPos = 0.0;
  fVar4 = 1.0 - this->cosFalloffStart;
  fVar3 = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  VVar7 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  fVar5 = this->cosFalloffStart;
  if (fVar5 <= VVar7.super_Tuple3<pbrt::Vector3,_float>.z) {
    fVar5 = (fVar4 * (1.0 / ((1.0 - fVar5) * 6.2831855))) / (fVar4 + fVar3);
  }
  else {
    auVar6._0_4_ = SmoothStepPDF(VVar7.super_Tuple3<pbrt::Vector3,_float>.z,this->cosFalloffEnd,
                                 fVar5);
    auVar6._4_60_ = extraout_var;
    auVar1 = vblendps_avx(ZEXT416((uint)(fVar3 + fVar4)),_DAT_028aec60,0xe);
    auVar2 = vinsertps_avx(ZEXT416((uint)fVar3),auVar6._0_16_,0x10);
    auVar1 = vdivps_avx(auVar2,auVar1);
    auVar2 = vmovshdup_avx(auVar1);
    fVar5 = auVar1._0_4_ * auVar2._0_4_;
  }
  *pdfDir = fVar5;
  return;
}

Assistant:

void SpotLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;

    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};

    Float cosTheta = CosTheta(renderFromLight.ApplyInverse(ray.d));
    if (cosTheta >= cosFalloffStart)
        *pdfDir = UniformConePDF(cosFalloffStart) * p[0] / (p[0] + p[1]);
    else
        *pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) / (2 * Pi) *
                  (p[1] / (p[0] + p[1]));
}